

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O0

int __thiscall
ncnn::InnerProduct::forward(InnerProduct *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float *pfVar2;
  long in_RCX;
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  bool bVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  int i_1;
  float *m_1;
  float *w_1;
  int q;
  float sum_1;
  int p_1;
  int i;
  float sum;
  float *kptr;
  int p;
  float *outptr;
  float *m;
  int j;
  int size;
  size_t elemsize;
  int channels;
  int h;
  int w;
  int num_input;
  float upper_1;
  float lower_1;
  float beta_1;
  float alpha_1;
  float max_1;
  float min_1;
  float slope_1;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  Mat *m_2;
  float local_3ac;
  Allocator *in_stack_fffffffffffffc58;
  size_t in_stack_fffffffffffffc60;
  undefined8 in_stack_fffffffffffffc68;
  int _w;
  Mat *in_stack_fffffffffffffc70;
  float local_364;
  int local_340;
  undefined8 local_330;
  undefined8 local_328;
  undefined8 local_320;
  undefined4 local_318;
  long local_310;
  undefined4 local_308;
  undefined4 local_304;
  undefined4 local_300;
  undefined4 local_2fc;
  undefined4 local_2f8;
  undefined8 local_2f0;
  long local_2e8;
  long local_2e0;
  int local_2d4;
  float local_2d0;
  int local_2cc;
  int local_2c8;
  float local_2c4;
  long local_2c0;
  int local_2b4;
  long local_2b0;
  long local_2a8;
  int local_2a0;
  int local_29c;
  long local_298;
  int local_290;
  int local_28c;
  int local_288;
  int local_284;
  long *local_278;
  long *local_270;
  int local_25c;
  undefined8 *local_258;
  long *local_248;
  long *local_240;
  int local_234;
  long *local_230;
  int local_224;
  long *local_220;
  undefined8 *local_218;
  long *local_210;
  long *local_208;
  long local_200;
  long *local_1f8;
  long local_1f0;
  long *local_1e8;
  float local_1dc;
  float local_1d8;
  float local_1d4;
  float local_1d0;
  float local_1cc;
  float local_1c8;
  float local_1c4;
  float local_1c0;
  float local_1bc;
  long *local_1b8;
  undefined4 local_1b0;
  float local_1ac [3];
  long *local_1a0;
  undefined8 local_198;
  long *local_190;
  undefined8 local_188;
  long *local_180;
  undefined8 local_178;
  long *local_170;
  undefined8 local_168;
  long *local_160;
  float local_154;
  float local_150;
  float local_14c;
  float local_148;
  float local_144;
  float local_140;
  float local_13c;
  float local_138;
  float local_134;
  long *local_130;
  undefined4 local_128;
  float local_124;
  Option *in_stack_fffffffffffffee0;
  Mat *in_stack_fffffffffffffee8;
  Mat *in_stack_fffffffffffffef0;
  InnerProduct *in_stack_fffffffffffffef8;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  
  if (((*(byte *)(in_RCX + 0x1e) & 1) == 0) || (*(long *)(in_RDI + 0x140) != 1)) {
    local_284 = *(int *)(in_RDI + 0xd8) / *(int *)(in_RDI + 0xd0);
    local_288 = *(int *)((long)in_RSI + 0x2c);
    local_28c = (int)in_RSI[6];
    local_290 = (int)in_RSI[7];
    local_298 = in_RSI[2];
    local_29c = local_288 * local_28c;
    _w = (int)((ulong)in_stack_fffffffffffffc68 >> 0x20);
    local_278 = in_RDX;
    local_270 = in_RSI;
    if (((int)in_RSI[5] == 2) && ((local_288 == local_284 && (1 < local_28c)))) {
      Mat::create(in_stack_fffffffffffffc70,_w,(int)in_stack_fffffffffffffc68,
                  in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
      local_240 = local_278;
      bVar3 = true;
      if (*local_278 != 0) {
        bVar3 = local_278[8] * (long)(int)local_278[7] == 0;
      }
      if (bVar3) {
        local_25c = -100;
      }
      else {
        for (local_2a0 = 0; local_2a0 < local_28c; local_2a0 = local_2a0 + 1) {
          local_230 = local_270;
          local_234 = local_2a0;
          local_2a8 = *local_270 +
                      (long)*(int *)((long)local_270 + 0x2c) * (long)local_2a0 * local_270[2];
          local_220 = local_278;
          local_224 = local_2a0;
          local_2b0 = *local_278 +
                      (long)*(int *)((long)local_278 + 0x2c) * (long)local_2a0 * local_278[2];
          for (local_2b4 = 0; local_2b4 < *(int *)(in_RDI + 0xd0); local_2b4 = local_2b4 + 1) {
            local_208 = (long *)(in_RDI + 0x130);
            local_2c0 = *local_208 + (long)(local_288 * local_2b4) * 4;
            local_2c4 = 0.0;
            if (*(int *)(in_RDI + 0xd4) != 0) {
              local_1e8 = (long *)(in_RDI + 0x178);
              local_1f0 = (long)local_2b4;
              local_2c4 = *(float *)(*local_1e8 + local_1f0 * 4);
            }
            for (local_2c8 = 0; fVar1 = local_2c4, local_2c8 < local_288; local_2c8 = local_2c8 + 1)
            {
              local_2c4 = *(float *)(local_2a8 + (long)local_2c8 * 4) *
                          *(float *)(local_2c0 + (long)local_2c8 * 4) + local_2c4;
            }
            local_128 = *(undefined4 *)(in_RDI + 0xe0);
            local_130 = (long *)(in_RDI + 0xe8);
            local_124 = local_2c4;
            switch(local_128) {
            case 1:
              dVar4 = std::fmax((double)(ulong)(uint)local_2c4,0.0);
              local_124 = SUB84(dVar4,0);
              break;
            case 2:
              local_134 = *(float *)*local_130;
              if (local_2c4 <= 0.0) {
                local_364 = local_2c4 * local_134;
              }
              else {
                local_364 = local_2c4;
              }
              local_124 = local_364;
              break;
            case 3:
              local_138 = *(float *)*local_130;
              local_13c = *(float *)(*local_130 + 4);
              if (local_2c4 < local_138) {
                local_124 = local_138;
              }
              if (local_13c < local_124) {
                local_124 = local_13c;
              }
              break;
            case 4:
              local_140 = 88.37626;
              pfVar2 = std::min<float>(&local_124,&local_140);
              local_124 = *pfVar2;
              local_144 = -88.37626;
              pfVar2 = std::max<float>(&local_124,&local_144);
              local_124 = *pfVar2;
              dVar4 = std::exp((double)(ulong)(uint)-local_124);
              local_124 = 1.0 / (SUB84(dVar4,0) + 1.0);
              break;
            case 5:
              auVar5._0_8_ = std::exp((double)(ulong)(uint)local_2c4);
              auVar5._8_8_ = extraout_XMM0_Qb;
              auVar6._4_12_ = auVar5._4_12_;
              auVar6._0_4_ = SUB84(auVar5._0_8_,0) + 1.0;
              dVar4 = std::log(auVar6._0_8_);
              dVar4 = std::tanh(dVar4);
              local_124 = fVar1 * SUB84(dVar4,0);
              break;
            case 6:
              local_148 = *(float *)*local_130;
              local_14c = *(float *)(*local_130 + 4);
              local_150 = -local_14c / local_148;
              local_154 = 1.0 / local_148 + local_150;
              if (local_150 <= local_2c4) {
                if (local_2c4 <= local_154) {
                  local_124 = local_2c4 * (local_2c4 * local_148 + local_14c);
                }
              }
              else {
                local_124 = 0.0;
              }
            }
            *(float *)(local_2b0 + (long)local_2b4 * 4) = local_124;
          }
        }
        local_25c = 0;
      }
    }
    else {
      Mat::create(in_stack_fffffffffffffc70,_w,in_stack_fffffffffffffc60,in_stack_fffffffffffffc58);
      local_248 = local_278;
      bVar3 = true;
      if (*local_278 != 0) {
        bVar3 = local_278[8] * (long)(int)local_278[7] == 0;
      }
      if (bVar3) {
        local_25c = -100;
      }
      else {
        for (local_2cc = 0; local_2cc < *(int *)(in_RDI + 0xd0); local_2cc = local_2cc + 1) {
          local_2d0 = 0.0;
          if (*(int *)(in_RDI + 0xd4) != 0) {
            local_1f8 = (long *)(in_RDI + 0x178);
            local_200 = (long)local_2cc;
            local_2d0 = *(float *)(*local_1f8 + local_200 * 4);
          }
          for (local_2d4 = 0; fVar1 = local_2d0, local_2d4 < local_290; local_2d4 = local_2d4 + 1) {
            local_210 = (long *)(in_RDI + 0x130);
            local_2e0 = *local_210 + (long)(local_29c * local_290 * local_2cc) * 4 +
                        (long)(local_29c * local_2d4) * 4;
            local_2e8 = *local_270 + local_270[8] * (long)local_2d4 * local_270[2];
            local_310 = local_270[4];
            local_218 = &local_330;
            local_258 = &local_330;
            local_330 = 0;
            local_320 = 0;
            local_318 = 0;
            local_308 = 0;
            local_304 = 0;
            local_300 = 0;
            local_2fc = 0;
            local_2f8 = 0;
            local_2f0 = 0;
            local_328 = 0;
            for (local_340 = 0; local_340 < local_29c; local_340 = local_340 + 1) {
              local_2d0 = *(float *)(local_2e8 + (long)local_340 * 4) *
                          *(float *)(local_2e0 + (long)local_340 * 4) + local_2d0;
            }
          }
          local_1b0 = *(undefined4 *)(in_RDI + 0xe0);
          local_1b8 = (long *)(in_RDI + 0xe8);
          local_1ac[0] = local_2d0;
          switch(local_1b0) {
          case 1:
            dVar4 = std::fmax((double)(ulong)(uint)local_2d0,0.0);
            local_1ac[0] = SUB84(dVar4,0);
            break;
          case 2:
            local_168 = 0;
            local_1bc = *(float *)*local_1b8;
            if (local_2d0 <= 0.0) {
              local_3ac = local_2d0 * local_1bc;
            }
            else {
              local_3ac = local_2d0;
            }
            local_1ac[0] = local_3ac;
            local_160 = local_1b8;
            break;
          case 3:
            local_178 = 0;
            local_1c0 = *(float *)*local_1b8;
            local_188 = 1;
            local_1c4 = *(float *)(*local_1b8 + 4);
            if (local_2d0 < local_1c0) {
              local_1ac[0] = local_1c0;
            }
            local_180 = local_1b8;
            local_170 = local_1b8;
            if (local_1c4 < local_1ac[0]) {
              local_1ac[0] = local_1c4;
            }
            break;
          case 4:
            local_1c8 = 88.37626;
            pfVar2 = std::min<float>(local_1ac,&local_1c8);
            local_1ac[0] = *pfVar2;
            local_1cc = -88.37626;
            pfVar2 = std::max<float>(local_1ac,&local_1cc);
            local_1ac[0] = *pfVar2;
            dVar4 = std::exp((double)(ulong)(uint)-local_1ac[0]);
            local_1ac[0] = 1.0 / (SUB84(dVar4,0) + 1.0);
            break;
          case 5:
            auVar7._0_8_ = std::exp((double)(ulong)(uint)local_2d0);
            auVar7._8_8_ = extraout_XMM0_Qb_00;
            auVar8._4_12_ = auVar7._4_12_;
            auVar8._0_4_ = SUB84(auVar7._0_8_,0) + 1.0;
            dVar4 = std::log(auVar8._0_8_);
            dVar4 = std::tanh(dVar4);
            local_1ac[0] = fVar1 * SUB84(dVar4,0);
            break;
          case 6:
            local_198 = 0;
            local_1d0 = *(float *)*local_1b8;
            local_1ac[1] = 1.4013e-45;
            local_1ac[2] = 0.0;
            local_1d4 = *(float *)(*local_1b8 + 4);
            local_1d8 = -local_1d4 / local_1d0;
            local_1dc = 1.0 / local_1d0 + local_1d8;
            local_1a0 = local_1b8;
            local_190 = local_1b8;
            if (local_1d8 <= local_2d0) {
              if (local_2d0 <= local_1dc) {
                local_1ac[0] = local_2d0 * (local_2d0 * local_1d0 + local_1d4);
              }
            }
            else {
              local_1ac[0] = 0.0;
            }
          }
          *(float *)(*local_278 + (long)local_2cc * 4) = local_1ac[0];
        }
        local_25c = 0;
      }
    }
  }
  else {
    local_25c = forward_int8(in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
                             in_stack_fffffffffffffee8,in_stack_fffffffffffffee0);
  }
  return local_25c;
}

Assistant:

int InnerProduct::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return forward_int8(bottom_blob, top_blob, opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    if (bottom_blob.dims == 2 && w == num_input && h > 1)
    {
        // gemm
        top_blob.create(num_output, h, elemsize, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int j = 0; j < h; j++)
        {
            const float* m = bottom_blob.row(j);
            float* outptr = top_blob.row(j);

            for (int p = 0; p < num_output; p++)
            {
                const float* kptr = (const float*)weight_data + w * p;

                float sum = 0.f;

                if (bias_term)
                    sum = bias_data[p];

                for (int i = 0; i < w; i++)
                {
                    sum += m[i] * kptr[i];
                }

                outptr[p] = activation_ss(sum, activation_type, activation_params);
            }
        }

        return 0;
    }

    top_blob.create(num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // num_output
    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < num_output; p++)
    {
        float sum = 0.f;

        if (bias_term)
            sum = bias_data[p];

        // channels
        for (int q = 0; q < channels; q++)
        {
            const float* w = (const float*)weight_data + size * channels * p + size * q;
            const float* m = bottom_blob.channel(q);

            for (int i = 0; i < size; i++)
            {
                sum += m[i] * w[i];
            }
        }

        top_blob[p] = activation_ss(sum, activation_type, activation_params);
    }

    return 0;
}